

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O2

void Gudhi::persistence_matrix::swap
               (Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                *base1,Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
                       *base2)

{
  bool bVar1;
  
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)base1,(_Vector_impl_data *)base2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&base1->rowToIndex_,(_Vector_impl_data *)&base2->rowToIndex_);
  bVar1 = base1->rowSwapped_;
  base1->rowSwapped_ = base2->rowSwapped_;
  base2->rowSwapped_ = bVar1;
  return;
}

Assistant:

void swap(Base_swap& base1, Base_swap& base2) {
    base1.indexToRow_.swap(base2.indexToRow_);
    base1.rowToIndex_.swap(base2.rowToIndex_);
    std::swap(base1.rowSwapped_, base2.rowSwapped_);
  }